

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void minMaxFinalize(sqlite3_context *context)

{
  Mem *pFrom;
  
  pFrom = (Mem *)sqlite3_aggregate_context(context,0);
  if (pFrom != (Mem *)0x0) {
    if (pFrom->flags != 0) {
      sqlite3VdbeMemCopy(&context->s,pFrom);
    }
    sqlite3VdbeMemRelease(pFrom);
    return;
  }
  return;
}

Assistant:

static void minMaxFinalize(sqlite3_context *context){
  sqlite3_value *pRes;
  pRes = (sqlite3_value *)sqlite3_aggregate_context(context, 0);
  if( pRes ){
    if( pRes->flags ){
      sqlite3_result_value(context, pRes);
    }
    sqlite3VdbeMemRelease(pRes);
  }
}